

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode ssl_cf_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  Curl_cfilter *pCVar1;
  undefined8 uVar2;
  CURLcode CVar3;
  
  if (query == 5) {
    CVar3 = CURLE_OK;
    if (((cf->field_0x24 & 1) != 0) && ((~cf->cft->flags & 10U) != 0)) {
      uVar2 = *(undefined8 *)((long)cf->ctx + 0x48);
      *(undefined8 *)pres2 = *(undefined8 *)((long)cf->ctx + 0x40);
      *(undefined8 *)((long)pres2 + 8) = uVar2;
      return CURLE_OK;
    }
  }
  else {
    pCVar1 = cf->next;
    if (pCVar1 != (Curl_cfilter *)0x0) {
      CVar3 = (*pCVar1->cft->query)(pCVar1,data,query,pres1,pres2);
      return CVar3;
    }
    CVar3 = CURLE_UNKNOWN_OPTION;
  }
  return CVar3;
}

Assistant:

static CURLcode ssl_cf_query(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             int query, int *pres1, void *pres2)
{
  struct ssl_connect_data *connssl = cf->ctx;

  switch(query) {
  case CF_QUERY_TIMER_APPCONNECT: {
    struct curltime *when = pres2;
    if(cf->connected && !Curl_ssl_cf_is_proxy(cf))
      *when = connssl->handshake_done;
    return CURLE_OK;
  }
  default:
    break;
  }
  return cf->next ?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}